

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O1

void DATA_CONVERSION::ConvertSamplesToSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,default_random_engine *generator)

{
  float *pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pvVar4;
  pointer pfVar5;
  iterator __position;
  void *pvVar6;
  ulong uVar7;
  pointer pvVar8;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_float>
  __aurng;
  vector<float,_std::allocator<float>_> *this;
  size_type __new_size;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  vector<float,_std::allocator<float>_> maxValues;
  vector<float,_std::allocator<float>_> minValues;
  value_type_conflict1 local_98;
  allocator_type local_91;
  size_type local_90;
  float local_88;
  float local_84;
  size_type local_80;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *local_78;
  float local_70;
  float local_6c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar8 = (samples->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar8 != (samples->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_88 = inputSimulationTime;
    local_78 = spikeTrains;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_48,
               (long)(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_60,
               (allocator_type *)&local_98);
    pvVar8 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_98 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_60,
               (long)*(pointer *)
                      ((long)&(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data >> 2,&local_98,&local_91);
    pvVar8 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pfVar2 = (pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_90 = (long)pfVar3 - (long)pfVar2 >> 2;
    if (pfVar3 != pfVar2) {
      lVar9 = 0;
      do {
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] = pfVar2[lVar9];
        *(float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar9 * 4) = pfVar2[lVar9];
        lVar9 = lVar9 + 1;
      } while (local_90 + (local_90 == 0) != lVar9);
    }
    pvVar4 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __new_size = ((long)pvVar4 - (long)pvVar8 >> 3) * -0x5555555555555555;
    if (pvVar4 != pvVar8) {
      lVar9 = 0;
      do {
        if (pfVar3 != pfVar2) {
          pfVar5 = pvVar8[lVar9].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = 0;
          do {
            fVar13 = pfVar5[lVar10];
            if (fVar13 < local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10]) {
              local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = fVar13;
            }
            fVar13 = pfVar5[lVar10];
            pfVar1 = (float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_60.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar10 * 4
                              );
            if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) {
              *(float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_,
                                  local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._0_4_) + lVar10 * 4) = fVar13;
            }
            lVar10 = lVar10 + 1;
          } while (local_90 + (local_90 == 0) != lVar10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != __new_size + (__new_size == 0));
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(local_78,__new_size);
    if ((samples->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (samples->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar9 = 0;
      uVar12 = 0;
      do {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)(*(long *)local_78 + lVar9),local_90);
        uVar12 = uVar12 + 1;
        uVar7 = ((long)(samples->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(samples->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar9 = lVar9 + 0x18;
      } while (uVar12 <= uVar7 && uVar7 - uVar12 != 0);
    }
    if (pfVar3 != pfVar2) {
      local_90 = local_90 + (local_90 == 0);
      local_80 = 0;
      local_68 = samples;
      do {
        pvVar8 = (local_68->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((local_68->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != pvVar8) {
          local_70 = *(float *)(CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_60.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) +
                               local_80 * 4) -
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[local_80];
          lVar9 = local_80 * 0x18;
          uVar12 = 0;
          do {
            if (0.0 < local_88) {
              local_6c = (pvVar8[uVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[local_80] -
                         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[local_80]) / local_70;
              local_84 = 0.0;
              iVar11 = 1;
              do {
                fVar13 = std::
                         generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                   (generator);
                if (fVar13 < local_6c) {
                  this = (vector<float,_std::allocator<float>_> *)
                         (*(long *)(*(long *)local_78 + uVar12 * 0x18) + lVar9);
                  fVar13 = std::
                           generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                     (generator);
                  local_98 = local_84 + fVar13 * 1e-06 + 0.0;
                  __position._M_current =
                       (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                              (this,__position,&local_98);
                  }
                  else {
                    *__position._M_current = local_98;
                    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                }
                local_84 = (float)iVar11;
                iVar11 = iVar11 + 1;
              } while (local_84 < local_88);
            }
            uVar12 = uVar12 + 1;
            pvVar8 = (local_68->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar7 = ((long)(local_68->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                    -0x5555555555555555;
          } while (uVar12 <= uVar7 && uVar7 - uVar12 != 0);
        }
        local_80 = local_80 + 1;
      } while (local_80 != local_90);
    }
    pvVar6 = (void *)CONCAT44(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6)
      ;
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        std::default_random_engine &generator )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            for ( int t = 0; t < inputSimulationTime; ++t ) {
                if ( distribution( generator ) < intensity ) {
                    spikeTrains[sid][activationId].emplace_back((float) t + timeNoiseDistribution( generator ));
                }
            }
        }
    }
}